

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O2

string * __thiscall
rcg::(anonymous_namespace)::cTLGetInfo_abi_cxx11_
          (string *__return_storage_ptr__,_anonymous_namespace_ *this,TL_HANDLE tl,
          shared_ptr<const_rcg::GenTLWrapper> *gentl,TL_INFO_CMD info)

{
  int iVar1;
  size_t i;
  ulong uVar2;
  INFO_DATATYPE type;
  size_t tmp_size;
  char tmp [1024];
  int local_434;
  ulong local_430;
  char local_428 [1032];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  memset(local_428,0,0x400);
  local_430 = 0x400;
  if (this == (_anonymous_namespace_ *)0x0) {
    iVar1 = (*(code *)**tl)((ulong)gentl & 0xffffffff,&local_434,local_428,&local_430);
  }
  else {
    iVar1 = (*(code *)(*tl)[0x11])(this,(ulong)gentl & 0xffffffff,&local_434,local_428,&local_430);
  }
  if ((iVar1 == 0) && (local_434 == 1)) {
    for (uVar2 = 0; (uVar2 < local_430 && (local_428[uVar2] != '\0')); uVar2 = uVar2 + 1) {
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string cTLGetInfo(GenTL::TL_HANDLE tl, const std::shared_ptr<const GenTLWrapper> &gentl,
                       GenTL::TL_INFO_CMD info)
{
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t tmp_size=sizeof(tmp);
  GenTL::GC_ERROR err=GenTL::GC_ERR_SUCCESS;

  if (tl != 0)
  {
    err=gentl->TLGetInfo(tl, info, &type, tmp, &tmp_size);
  }
  else
  {
    err=gentl->GCGetInfo(info, &type, tmp, &tmp_size);
  }

  if (err == GenTL::GC_ERR_SUCCESS && type == GenTL::INFO_DATATYPE_STRING)
  {
    for (size_t i=0; i<tmp_size && tmp[i] != '\0'; i++)
    {
      ret.push_back(tmp[i]);
    }
  }

  return ret;
}